

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool parse_vrplib_depot_section(VrplibParser *p,Instance *instance)

{
  _Bool _Var1;
  ulong in_RAX;
  char *string;
  int iVar2;
  char *fmt;
  bool bVar3;
  bool bVar4;
  int32_t nodeid;
  undefined8 uStack_38;
  
  bVar3 = true;
  iVar2 = 0;
  uStack_38 = in_RAX;
  do {
    string = get_token_lexeme(p);
    if (string == (char *)0x0) {
      bVar3 = false;
    }
    else {
      uStack_38 = uStack_38 & 0xffffffff;
      _Var1 = str_to_int32(string,(int32_t *)((long)&uStack_38 + 4));
      if (_Var1) {
        if (iVar2 == 0) {
          if (uStack_38._4_4_ != 1) {
            fmt = "Expected single depot with index `1`. Got `%d` instead";
            goto LAB_0010611a;
          }
        }
        else if (uStack_38._4_4_ != -1) {
          fmt = "Expected value `-1` marking the end of the depot section, Found `%d` instead";
LAB_0010611a:
          bVar3 = false;
          parse_error(p,fmt);
        }
      }
      else {
        bVar3 = false;
        parse_error(p,"Expected valid integer for DEPOT_SECTION");
      }
    }
    if (string != (char *)0x0) {
      free(string);
    }
    _Var1 = parser_match_newline(p);
    if (!_Var1) {
      bVar3 = false;
      parse_error(p,"Expected newline");
    }
    bVar4 = iVar2 != 0;
    iVar2 = iVar2 + -1;
    if ((!bVar3) || (bVar4)) {
      return bVar3;
    }
  } while( true );
}

Assistant:

static bool parse_vrplib_depot_section(VrplibParser *p, Instance *instance) {
    UNUSED_PARAM(instance);
    bool result = true;
    for (int32_t i = 0; result && (i <= 1); i++) {
        char *lexeme = get_token_lexeme(p);
        if (!lexeme) {
            result = false;
        } else {
            int32_t nodeid = 0;
            if (!str_to_int32(lexeme, &nodeid)) {
                parse_error(p, "Expected valid integer for DEPOT_SECTION");
                result = false;
            } else {
                if (i == 0) {
                    if (nodeid != 1) {
                        parse_error(p,
                                    "Expected single depot with index `1`. Got "
                                    "`%d` instead",
                                    nodeid);
                        result = false;
                    }
                } else {
                    if (nodeid != -1) {
                        parse_error(p,
                                    "Expected value `-1` marking the end of "
                                    "the depot section, Found `%d` instead",
                                    nodeid);
                        result = false;
                    }
                }
            }
        }

        if (lexeme) {
            free(lexeme);
        }

        if (!parser_match_newline(p)) {
            parse_error(p, "Expected newline");
            result = false;
        }
    }

    return result;
}